

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.cc
# Opt level: O2

uint8 * __thiscall
sentencepiece::SelfTestData::_InternalSerialize
          (SelfTestData *this,uint8 *target,EpsCopyOutputStream *stream)

{
  int iVar1;
  void *pvVar2;
  uint8 *puVar3;
  Type *this_00;
  ulong uVar4;
  int index;
  
  iVar1 = (this->samples_).super_RepeatedPtrFieldBase.current_size_;
  for (index = 0; iVar1 != index; index = index + 1) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<sentencepiece::SelfTestData_Sample>::TypeHandler>
                        (&(this->samples_).super_RepeatedPtrFieldBase,index);
    *puVar3 = '\n';
    puVar3 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArray
                       ((this_00->_cached_size_).size_.super___atomic_base<int>._M_i,puVar3 + 1);
    target = SelfTestData_Sample::_InternalSerialize(this_00,puVar3,stream);
  }
  puVar3 = google::protobuf::internal::ExtensionSet::_InternalSerialize
                     (&this->_extensions_,200,0x20000000,target,stream);
  pvVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)pvVar2 & 1) == 0) {
    return puVar3;
  }
  uVar4 = (ulong)pvVar2 & 0xfffffffffffffffe;
  puVar3 = google::protobuf::io::EpsCopyOutputStream::WriteRaw
                     (stream,*(void **)(uVar4 + 8),*(int *)(uVar4 + 0x10),puVar3);
  return puVar3;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* SelfTestData::_InternalSerialize(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:sentencepiece.SelfTestData)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated .sentencepiece.SelfTestData.Sample samples = 1;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_samples_size()); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(1, this->_internal_samples(i), target, stream);
  }

  // Extension range [200, 536870912)
  target = _extensions_._InternalSerialize(
      200, 536870912, target, stream);

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:sentencepiece.SelfTestData)
  return target;
}